

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  reference pcVar5;
  bool value_00;
  const_iterator local_150;
  const_iterator local_148;
  _List_node_base *local_140;
  _List_node_base *local_138;
  string local_130;
  cmExpandedCommandArgument local_110;
  undefined1 local_e5;
  bool value;
  allocator<cmExpandedCommandArgument> local_d1;
  _List_node_base *local_d0;
  _List_iterator<cmExpandedCommandArgument> local_c8;
  _List_iterator<cmExpandedCommandArgument> local_c0;
  undefined1 local_b8 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> subExpr;
  iterator local_98;
  _List_iterator<cmExpandedCommandArgument> argOpen;
  _Self local_70;
  _List_node_base *local_68;
  _Self local_60;
  _List_iterator<cmExpandedCommandArgument> argClose;
  int depth;
  _Self local_40;
  _Self local_38;
  iterator arg;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  arg._M_node = (_List_node_base *)status;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
       begin(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
  do {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         end(&newArgs->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>);
    bVar3 = std::operator!=(&local_38,&local_40);
    pcVar2 = DAT_010045f8;
    sVar1 = (anonymous_namespace)::keyParenL;
    if (!bVar3) {
      return true;
    }
    pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_38);
    keyword_01.super_string_view._M_str = pcVar2;
    keyword_01.super_string_view._M_len = sVar1;
    bVar3 = IsKeyword(this,keyword_01,pcVar5);
    if (bVar3) {
      argClose._M_node._4_4_ = 1;
      local_68 = local_38._M_node;
      local_60._M_node =
           (_List_node_base *)
           std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_38._M_node,1);
      while( true ) {
        local_70._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (&newArgs->
                         super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                       );
        bVar3 = std::operator!=(&local_60,&local_70);
        pcVar2 = DAT_010045f8;
        sVar1 = (anonymous_namespace)::keyParenL;
        if (!bVar3 || argClose._M_node._4_4_ == 0) break;
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_60);
        keyword_00.super_string_view._M_str = pcVar2;
        keyword_00.super_string_view._M_len = sVar1;
        bVar3 = IsKeyword(this,keyword_00,pcVar5);
        pcVar2 = DAT_01004608;
        argOpen._M_node = (anonymous_namespace)::keyParenR;
        pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_60);
        keyword.super_string_view._M_str = pcVar2;
        keyword.super_string_view._M_len = (size_t)argOpen._M_node;
        bVar4 = IsKeyword(this,keyword,pcVar5);
        argClose._M_node._4_4_ = ((uint)bVar3 - (uint)bVar4) + argClose._M_node._4_4_;
        std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_60);
      }
      if (argClose._M_node._4_4_ != 0) {
        std::__cxx11::string::operator=((string *)errorString,"mismatched parenthesis in condition")
        ;
        *(undefined4 *)&(arg._M_node)->_M_next = 2;
        return false;
      }
      subExpr.
      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_38._M_node;
      local_c0 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_38._M_node,1);
      local_d0 = local_60._M_node;
      local_98._M_node = local_c0._M_node;
      local_c8 = std::prev<std::_List_iterator<cmExpandedCommandArgument>>(local_60._M_node,1);
      std::allocator<cmExpandedCommandArgument>::allocator(&local_d1);
      std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
      vector<std::_List_iterator<cmExpandedCommandArgument>,void>
                ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                 local_b8,local_c0,local_c8,&local_d1);
      std::allocator<cmExpandedCommandArgument>::~allocator(&local_d1);
      local_e5 = IsTrue(this,(vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)local_b8,errorString,(MessageType *)arg._M_node);
      (anonymous_namespace)::bool2string_abi_cxx11_
                (&local_130,(_anonymous_namespace_ *)(ulong)(byte)local_e5,value_00);
      cmExpandedCommandArgument::cmExpandedCommandArgument(&local_110,&local_130,true);
      pcVar5 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_38);
      cmExpandedCommandArgument::operator=(pcVar5,&local_110);
      cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      local_140 = local_38._M_node;
      local_138 = (_List_node_base *)
                  std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_38._M_node,1);
      local_98._M_node = local_138;
      std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                (&local_148,&local_98);
      std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                (&local_150,&local_60);
      std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
      erase(&newArgs->
             super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
            local_148,local_150);
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                 local_b8);
    }
    std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_38);
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto arg = newArgs.begin(); arg != newArgs.end(); ++arg) {
    if (this->IsKeyword(keyParenL, *arg)) {
      // search for the closing paren for this opening one
      auto depth = 1;
      auto argClose = std::next(arg);
      for (; argClose != newArgs.end() && depth; ++argClose) {
        depth += int(this->IsKeyword(keyParenL, *argClose)) -
          int(this->IsKeyword(keyParenR, *argClose));
      }
      if (depth) {
        errorString = "mismatched parenthesis in condition";
        status = MessageType::FATAL_ERROR;
        return false;
      }

      // store the reduced args in this vector
      auto argOpen = std::next(arg);
      const std::vector<cmExpandedCommandArgument> subExpr(
        argOpen, std::prev(argClose));

      // now recursively invoke IsTrue to handle the values inside the
      // parenthetical expression
      const auto value = this->IsTrue(subExpr, errorString, status);
      *arg = cmExpandedCommandArgument(bool2string(value), true);
      argOpen = std::next(arg);
      // remove the now evaluated parenthetical expression
      newArgs.erase(argOpen, argClose);
    }
  }
  return true;
}